

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_frommesh.cpp
# Opt level: O2

ON_SubD * ON_SubD::CreateFromMesh
                    (ON_Mesh *level_zero_mesh,ON_SubDFromMeshParameters *from_mesh_options,
                    ON_SubD *subd)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ON_MeshNgon *ngon;
  ON_Mesh *this;
  ON_SubD *pOVar4;
  ON_SimpleArray<unsigned_int> ngons_with_holes;
  ON_NgonBoundaryChecker bc;
  uint local_8ac;
  ON_SimpleArray<unsigned_int> local_8a8;
  ON_SubD *local_890;
  ON_NgonBoundaryChecker local_888;
  
  if (level_zero_mesh == (ON_Mesh *)0x0) {
    this = (ON_Mesh *)0x0;
    level_zero_mesh = (ON_Mesh *)0x0;
  }
  else {
    local_890 = subd;
    ON_NgonBoundaryChecker::ON_NgonBoundaryChecker(&local_888);
    uVar2 = ON_Mesh::NgonUnsignedCount(level_zero_mesh);
    ON_SimpleArray<unsigned_int>::ON_SimpleArray(&local_8a8,(ulong)uVar2);
    for (local_8ac = 0; local_8ac < uVar2; local_8ac = local_8ac + 1) {
      ngon = ON_Mesh::Ngon(level_zero_mesh,local_8ac);
      if ((((ngon != (ON_MeshNgon *)0x0) && (2 < ngon->m_Vcount)) && (1 < ngon->m_Fcount)) &&
         (bVar1 = ON_NgonBoundaryChecker::IsSimpleNgon(&local_888,ngon,level_zero_mesh,false),
         !bVar1)) {
        ON_SimpleArray<unsigned_int>::Append(&local_8a8,&local_8ac);
      }
    }
    if (local_8a8.m_count == 0) {
      this = (ON_Mesh *)0x0;
    }
    else {
      this = (ON_Mesh *)operator_new(0x6e0);
      ON_Mesh::ON_Mesh(this,level_zero_mesh);
      uVar3 = ON_Mesh::NgonUnsignedCount(this);
      if ((uVar2 == uVar3) &&
         (uVar2 = ON_Mesh::RemoveNgons(this,local_8a8.m_count,local_8a8.m_a), uVar2 != 0)) {
        level_zero_mesh = this;
      }
    }
    ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&local_8a8);
    ON_FixedSizePool::~ON_FixedSizePool(&local_888.m_fsp);
    subd = local_890;
  }
  pOVar4 = Internal_CreateFromMeshWithValidNgons(level_zero_mesh,from_mesh_options,subd);
  if (this != (ON_Mesh *)0x0) {
    (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this);
  }
  return pOVar4;
}

Assistant:

ON_SubD* ON_SubD::CreateFromMesh(
  const class ON_Mesh* level_zero_mesh,
  const class ON_SubDFromMeshParameters* from_mesh_options,
  ON_SubD* subd
)
{
  ON_Mesh* local_copy = nullptr;
  if (nullptr != level_zero_mesh)
  {
    // remove ngons with holes and other damaged ngons so the underlying faces get used.

    ON_NgonBoundaryChecker bc;
    const bool bMustBeOrientedNgon = false;

    const unsigned ngon_count = level_zero_mesh->NgonUnsignedCount();
    ON_SimpleArray<unsigned> ngons_with_holes(ngon_count);
    for (unsigned ni = 0; ni < ngon_count; ++ni)
    {
      const class ON_MeshNgon* ngon = level_zero_mesh->Ngon(ni);
      if ( nullptr == ngon)
        continue;
      if (ngon->m_Vcount < 3 || ngon->m_Fcount <= 1)
        continue;
      if ( false == bc.IsSimpleNgon(ngon, level_zero_mesh,bMustBeOrientedNgon) )
        ngons_with_holes.Append(ni);
    }

    for (;;)
    {
      if (0 == ngons_with_holes.UnsignedCount())
        break;
      local_copy = new ON_Mesh(*level_zero_mesh);
      if (nullptr == local_copy)
        break;
      if (ngon_count != local_copy->NgonUnsignedCount())
        break;
      const unsigned removed_count = local_copy->RemoveNgons(ngons_with_holes.UnsignedCount(), ngons_with_holes.Array());
      if (removed_count > 0)
        level_zero_mesh = local_copy;
      break;
    }
  }

  ON_SubD* subd_from_mesh = Internal_CreateFromMeshWithValidNgons(level_zero_mesh, from_mesh_options, subd);
  if (nullptr != local_copy)
    delete local_copy;
  return subd_from_mesh;
}